

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass_manager.cpp
# Opt level: O3

Status __thiscall spvtools::opt::PassManager::Run(PassManager *this,IRContext *context)

{
  ostream *poVar1;
  Pass *pPVar2;
  _Manager_type p_Var3;
  Module *this_00;
  pointer puVar4;
  bool bVar5;
  int iVar6;
  Status SVar7;
  uint32_t uVar8;
  undefined4 extraout_var;
  pointer puVar9;
  pointer *__ptr;
  char *pcVar10;
  pointer puVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> binary;
  SpirvTools tools;
  ScopedTimer<spvtools::utils::Timer> timer__LINE__;
  string msg;
  spv_position_t null_pos;
  Status local_ec;
  undefined1 local_e0 [16];
  long lStack_d0;
  long local_c8;
  _func_int **local_c0;
  code *local_b8;
  pointer local_b0;
  SpirvTools local_a8;
  ScopedTimer<spvtools::utils::Timer> local_a0;
  _Any_data local_88;
  _Manager_type local_78;
  _Invoker_type p_Stack_70;
  long *local_68 [2];
  long local_58 [2];
  spv_position_t local_48;
  
  local_e0._0_8_ = context;
  utils::PrintTimerDescription(this->time_report_stream_,true);
  puVar9 = (this->passes_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_b0 = (this->passes_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar9 == local_b0) {
    Run::anon_class_16_2_5d5469c6::operator()
              ((anon_class_16_2_5d5469c6 *)local_e0,(char *)this,(Pass *)"; IR after last pass");
    local_ec = SuccessWithoutChange;
  }
  else {
    local_b8 = utils::Timer::Start;
    local_ec = SuccessWithoutChange;
    local_c0 = (_func_int **)&PTR_Start_00428cb0;
    do {
      Run::anon_class_16_2_5d5469c6::operator()
                ((anon_class_16_2_5d5469c6 *)local_e0,(char *)this,(Pass *)"; IR before pass ");
      poVar1 = this->time_report_stream_;
      pPVar2 = (puVar9->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
               .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl;
      pcVar10 = "";
      if (pPVar2 != (Pass *)0x0) {
        iVar6 = (*pPVar2->_vptr_Pass[2])();
        pcVar10 = (char *)CONCAT44(extraout_var,iVar6);
      }
      local_a0._vptr_ScopedTimer = (_func_int **)&PTR__ScopedTimer_003d7e48;
      local_a0.timer = (Timer *)operator_new(0x180);
      (local_a0.timer)->_vptr_Timer = local_c0;
      (local_a0.timer)->report_stream_ = poVar1;
      (local_a0.timer)->usage_status_ = 0;
      (local_a0.timer)->measure_mem_usage_ = true;
      local_a0.tag_ = pcVar10;
      (*local_b8)(local_a0.timer);
      SVar7 = Pass::Run((puVar9->_M_t).
                        super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
                        .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl,context);
      if (SVar7 == SuccessWithChange) {
        local_ec = SuccessWithChange;
      }
      else if (SVar7 == Failure) goto LAB_00188800;
      if (this->validate_after_all_ == true) {
        SpirvTools::SpirvTools(&local_a8,this->target_env_);
        local_78 = (_Manager_type)0x0;
        p_Stack_70 = (_Invoker_type)0x0;
        local_88._M_unused._M_object = (void *)0x0;
        local_88._8_8_ = 0;
        p_Var3 = (this->consumer_).super__Function_base._M_manager;
        if (p_Var3 != (_Manager_type)0x0) {
          (*p_Var3)(&local_88,(_Any_data *)this,__clone_functor);
          local_78 = (this->consumer_).super__Function_base._M_manager;
          p_Stack_70 = (this->consumer_)._M_invoker;
        }
        SpirvTools::SetMessageConsumer(&local_a8,(MessageConsumer *)&local_88);
        if (local_78 != (_Manager_type)0x0) {
          (*local_78)(&local_88,&local_88,__destroy_functor);
        }
        local_e0._8_8_ = (PassManager *)0x0;
        lStack_d0 = 0;
        local_c8 = 0;
        Module::ToBinary((context->module_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                         .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl,
                         (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_e0 + 8),true)
        ;
        bVar5 = SpirvTools::Validate
                          (&local_a8,(uint32_t *)local_e0._8_8_,lStack_d0 - local_e0._8_8_ >> 2,
                           this->val_options_);
        if (!bVar5) {
          local_68[0] = local_58;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_68,"Validation failed after pass ","");
          (*((puVar9->_M_t).
             super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>.
             _M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
             .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl)->_vptr_Pass[2])();
          std::__cxx11::string::append((char *)local_68);
          local_48.line = 0;
          local_48.column = 0;
          local_48.index = 0;
          std::
          function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
          operator()(&this->consumer_,SPV_MSG_INTERNAL_ERROR,"",&local_48,(char *)local_68[0]);
          if (local_68[0] != local_58) {
            operator_delete(local_68[0],local_58[0] + 1);
          }
          if ((PassManager *)local_e0._8_8_ != (PassManager *)0x0) {
            operator_delete((void *)local_e0._8_8_,local_c8 - local_e0._8_8_);
          }
          SpirvTools::~SpirvTools(&local_a8);
LAB_00188800:
          utils::ScopedTimer<spvtools::utils::Timer>::~ScopedTimer(&local_a0);
          return Failure;
        }
        if ((PassManager *)local_e0._8_8_ != (PassManager *)0x0) {
          operator_delete((void *)local_e0._8_8_,local_c8 - local_e0._8_8_);
        }
        SpirvTools::~SpirvTools(&local_a8);
      }
      pPVar2 = (puVar9->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
               .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl;
      (puVar9->_M_t).
      super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>.
      super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl = (Pass *)0x0;
      if (pPVar2 != (Pass *)0x0) {
        (*pPVar2->_vptr_Pass[1])();
      }
      utils::ScopedTimer<spvtools::utils::Timer>::~ScopedTimer(&local_a0);
      puVar9 = puVar9 + 1;
    } while (puVar9 != local_b0);
    Run::anon_class_16_2_5d5469c6::operator()
              ((anon_class_16_2_5d5469c6 *)local_e0,(char *)this,(Pass *)"; IR after last pass");
    if (local_ec == SuccessWithChange) {
      this_00 = (context->module_)._M_t.
                super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                ._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
      uVar8 = Module::ComputeIdBound(this_00);
      if (uVar8 == 0) {
        __assert_fail("bound != 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/module.h"
                      ,0x3c,"void spvtools::opt::Module::SetIdBound(uint32_t)");
      }
      (this_00->header_).bound = uVar8;
      local_ec = SuccessWithChange;
    }
  }
  puVar9 = (this->passes_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (this->passes_).
           super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  puVar11 = puVar9;
  if (puVar4 != puVar9) {
    do {
      pPVar2 = (puVar11->_M_t).
               super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>
               .super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl;
      if (pPVar2 != (Pass *)0x0) {
        (*pPVar2->_vptr_Pass[1])();
      }
      (puVar11->_M_t).
      super___uniq_ptr_impl<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Pass_*,_std::default_delete<spvtools::opt::Pass>_>.
      super__Head_base<0UL,_spvtools::opt::Pass_*,_false>._M_head_impl = (Pass *)0x0;
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar4);
    (this->passes_).
    super__Vector_base<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>,_std::allocator<std::unique_ptr<spvtools::opt::Pass,_std::default_delete<spvtools::opt::Pass>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar9;
  }
  return local_ec;
}

Assistant:

Pass::Status PassManager::Run(IRContext* context) {
  auto status = Pass::Status::SuccessWithoutChange;

  // If print_all_stream_ is not null, prints the disassembly of the module
  // to that stream, with the given preamble and optionally the pass name.
  auto print_disassembly = [&context, this](const char* preamble, Pass* pass) {
    if (print_all_stream_) {
      std::vector<uint32_t> binary;
      context->module()->ToBinary(&binary, false);
      SpirvTools t(target_env_);
      t.SetMessageConsumer(consumer());
      std::string disassembly;
      std::string pass_name = (pass ? pass->name() : "");
      if (!t.Disassemble(binary, &disassembly)) {
        std::string msg = "Disassembly failed before pass ";
        msg += pass_name + "\n";
        spv_position_t null_pos{0, 0, 0};
        consumer()(SPV_MSG_WARNING, "", null_pos, msg.c_str());
        return;
      }
      *print_all_stream_ << preamble << pass_name << "\n"
                         << disassembly << std::endl;
    }
  };

  SPIRV_TIMER_DESCRIPTION(time_report_stream_, /* measure_mem_usage = */ true);
  for (auto& pass : passes_) {
    print_disassembly("; IR before pass ", pass.get());
    SPIRV_TIMER_SCOPED(time_report_stream_, (pass ? pass->name() : ""), true);
    const auto one_status = pass->Run(context);
    if (one_status == Pass::Status::Failure) return one_status;
    if (one_status == Pass::Status::SuccessWithChange) status = one_status;

    if (validate_after_all_) {
      spvtools::SpirvTools tools(target_env_);
      tools.SetMessageConsumer(consumer());
      std::vector<uint32_t> binary;
      context->module()->ToBinary(&binary, true);
      if (!tools.Validate(binary.data(), binary.size(), val_options_)) {
        std::string msg = "Validation failed after pass ";
        msg += pass->name();
        spv_position_t null_pos{0, 0, 0};
        consumer()(SPV_MSG_INTERNAL_ERROR, "", null_pos, msg.c_str());
        return Pass::Status::Failure;
      }
    }

    // Reset the pass to free any memory used by the pass.
    pass.reset(nullptr);
  }
  print_disassembly("; IR after last pass", nullptr);

  // Set the Id bound in the header in case a pass forgot to do so.
  //
  // TODO(dnovillo): This should be unnecessary and automatically maintained by
  // the IRContext.
  if (status == Pass::Status::SuccessWithChange) {
    context->module()->SetIdBound(context->module()->ComputeIdBound());
  }
  passes_.clear();
  return status;
}